

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O2

void __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::SearchableObjectHolder
          (SearchableObjectHolder<helics::Broker,_helics::CoreType> *this)

{
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(SearchableObjectHolder<helics::Broker,_helics::CoreType> **)(this + 0x40) = this + 0x30;
  *(SearchableObjectHolder<helics::Broker,_helics::CoreType> **)(this + 0x48) = this + 0x30;
  *(undefined8 *)(this + 0x50) = 0;
  *(undefined4 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x68) = 0;
  *(SearchableObjectHolder<helics::Broker,_helics::CoreType> **)(this + 0x70) = this + 0x60;
  *(SearchableObjectHolder<helics::Broker,_helics::CoreType> **)(this + 0x78) = this + 0x60;
  *(undefined8 *)(this + 0x80) = 0;
  TripWireDetector::TripWireDetector((TripWireDetector *)(this + 0x88));
  return;
}

Assistant:

SearchableObjectHolder() = default;